

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Gia_ManDumpTestsSimulate(Gia_Man_t *p,Vec_Int_t *vValues)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int k;
  Gia_Obj_t *pObj;
  Vec_Int_t *vValues_local;
  Gia_Man_t *p_local;
  
  iVar3 = Vec_IntSize(vValues);
  iVar4 = Gia_ManCiNum(p);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_IntSize(vValues) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                  ,0x2ea,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
  }
  pGVar7 = Gia_ManConst0(p);
  *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
  local_24 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vCis);
    bVar8 = false;
    if (local_24 < iVar3) {
      pGStack_20 = Gia_ManCi(p,local_24);
      bVar8 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar6 = Vec_IntEntry(vValues,local_24);
    *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0xffffffffbfffffff | ((ulong)uVar6 & 1) << 0x1e;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar8 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar8 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar3 = Gia_ObjIsAnd(pGStack_20);
    if (iVar3 != 0) {
      pGVar7 = Gia_ObjFanin0(pGStack_20);
      uVar2 = *(ulong *)pGVar7;
      uVar6 = Gia_ObjFaninC0(pGStack_20);
      pGVar7 = Gia_ObjFanin1(pGStack_20);
      uVar1 = *(ulong *)pGVar7;
      uVar5 = Gia_ObjFaninC1(pGStack_20);
      *(ulong *)pGStack_20 =
           *(ulong *)pGStack_20 & 0xffffffffbfffffff |
           ((ulong)(((uint)(uVar2 >> 0x1e) & 1 ^ uVar6) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar5)) & 1)
           << 0x1e;
    }
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (local_24 < iVar3) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar8 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pGVar7 = Gia_ObjFanin0(pGStack_20);
    uVar2 = *(ulong *)pGVar7;
    uVar6 = Gia_ObjFaninC0(pGStack_20);
    *(ulong *)pGStack_20 =
         *(ulong *)pGStack_20 & 0xffffffffbfffffff |
         ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar6) & 1) << 0x1e;
    local_24 = local_24 + 1;
  }
  Vec_IntClear(vValues);
  local_24 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar8 = false;
    if (local_24 < iVar3) {
      iVar3 = Gia_ManPoNum(p);
      pGStack_20 = Gia_ManCo(p,iVar3 + local_24);
      bVar8 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    Vec_IntPush(vValues,(uint)(*(ulong *)pGStack_20 >> 0x1e) & 1);
    local_24 = local_24 + 1;
  }
  iVar3 = Vec_IntSize(vValues);
  iVar4 = Gia_ManRegNum(p);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_IntSize(vValues) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                  ,0x2f7,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

void Gia_ManDumpTestsSimulate( Gia_Man_t * p, Vec_Int_t * vValues )
{
    Gia_Obj_t * pObj; int k;
    assert( Vec_IntSize(vValues) == Gia_ManCiNum(p) );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachCi( p, pObj, k )
        pObj->fMark0 = Vec_IntEntry( vValues, k );
    Gia_ManForEachAnd( p, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    Gia_ManForEachCo( p, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // collect flop input values
    Vec_IntClear( vValues );
    Gia_ManForEachRi( p, pObj, k )
        Vec_IntPush( vValues, pObj->fMark0 );
    assert( Vec_IntSize(vValues) == Gia_ManRegNum(p) );
}